

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

void __thiscall FBehavior::SerializeVarSet(FBehavior *this,FArchive *arc,SDWORD *vars,int max)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  DWORD DVar7;
  SDWORD arcval;
  DWORD local_34;
  DWORD local_30;
  DWORD local_2c;
  
  if (arc->m_Storing == true) {
    if (max < 1) {
      uVar5 = 0;
    }
    else {
      uVar4 = 0;
      do {
        uVar5 = uVar4;
        if (vars[uVar4] != 0) break;
        uVar4 = uVar4 + 1;
        uVar5 = (ulong)(uint)max;
      } while ((uint)max != uVar4);
    }
    local_34 = (DWORD)uVar5;
    DVar7 = max;
    if ((int)local_34 < max) {
      DVar7 = local_34;
    }
    local_30 = DVar7 - 1;
    lVar6 = (long)max;
    do {
      if (lVar6 <= (int)local_34) goto LAB_004d470a;
      lVar1 = lVar6 + -1;
      lVar3 = lVar6 + -1;
      lVar6 = lVar1;
    } while (vars[lVar3] == 0);
    local_30 = (DWORD)lVar1;
    DVar7 = local_30 + 1;
LAB_004d470a:
    local_2c = DVar7 - local_34;
    if (local_2c == 0 || (int)DVar7 < (int)local_34) {
      local_2c = 0;
      FArchive::operator<<(arc,&local_2c);
    }
    else {
      FArchive::operator<<(arc,&local_2c);
      local_2c = local_34;
      FArchive::operator<<(arc,&local_2c);
      if ((int)local_34 <= (int)local_30) {
        do {
          FArchive::operator<<(arc,(DWORD *)(vars + (int)local_34));
          bVar2 = (int)local_34 < (int)local_30;
          local_34 = local_34 + 1;
        } while (bVar2);
      }
    }
  }
  else {
    memset(vars,0,(long)max << 2);
    FArchive::operator<<(arc,&local_30);
    if (local_30 != 0) {
      FArchive::operator<<(arc,&local_34);
      DVar7 = local_30 + local_34;
      local_30 = max;
      if ((int)DVar7 < max) {
        local_30 = DVar7;
      }
      if ((int)local_34 < (int)local_30) {
        do {
          FArchive::operator<<(arc,(DWORD *)(vars + (int)local_34));
          local_34 = local_34 + 1;
        } while ((int)local_34 < (int)local_30);
      }
      if ((int)local_34 < (int)DVar7) {
        do {
          FArchive::operator<<(arc,&local_2c);
          local_34 = local_34 + 1;
        } while ((int)local_34 < (int)DVar7);
      }
    }
  }
  return;
}

Assistant:

void FBehavior::SerializeVarSet (FArchive &arc, SDWORD *vars, int max)
{
	SDWORD arcval;
	SDWORD first, last;

	if (arc.IsStoring ())
	{
		// Find first non-zero variable
		for (first = 0; first < max; ++first)
		{
			if (vars[first] != 0)
			{
				break;
			}
		}

		// Find last non-zero variable
		for (last = max - 1; last >= first; --last)
		{
			if (vars[last] != 0)
			{
				break;
			}
		}

		if (last < first)
		{ // no non-zero variables
			arcval = 0;
			arc << arcval;
			return;
		}

		arcval = last - first + 1;
		arc << arcval;
		arcval = first;
		arc << arcval;

		while (first <= last)
		{
			arc << vars[first];
			++first;
		}
	}
	else
	{
		SDWORD truelast;

		memset (vars, 0, max*sizeof(*vars));

		arc << last;
		if (last == 0)
		{
			return;
		}
		arc << first;
		last += first;
		truelast = last;

		if (last > max)
		{
			last = max;
		}

		while (first < last)
		{
			arc << vars[first];
			++first;
		}
		while (first < truelast)
		{
			arc << arcval;
			++first;
		}
	}
}